

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

void density_tests::detail::
     PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>
     ::
     consume_impl<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>::consume_operation>
               (consume_operation *i_consume)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  runtime_type<> *prVar3;
  Data *pDVar4;
  long lVar5;
  size_t i;
  long lVar6;
  unsigned_long size;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  prVar3 = density::
           sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
           ::consume_operation::complete_type((consume_operation *)i_consume);
  if (prVar3->m_feature_table !=
      (tuple_type *)
      density::detail::
      FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>::Data>
      ::s_table) {
    assert_failed<>("i_consume.complete_type().template is<ElementType>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0x198);
  }
  pDVar4 = density::
           sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
           ::consume_operation::
           element<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>::Data>
                     ((consume_operation *)i_consume);
  lVar8 = (long)(pDVar4->m_blocks).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pDVar4->m_blocks).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  exception_checkpoint();
  lVar9 = lVar8;
  for (lVar5 = 0; uVar7 = lVar8 - lVar5, uVar7 != 0; lVar5 = lVar5 + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar7;
    pcVar1 = (pDVar4->m_blocks).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5];
    for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
      if ((SUB164(auVar2 % ZEXT816(10),0) | 0x30) != (int)pcVar1[lVar6]) {
        assert_failed<>("chars[i] == fill_char",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                        ,0x1a6);
      }
    }
    if (pcVar1[uVar7] != '\0') {
      assert_failed<>("chars[size] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                      ,0x1a8);
    }
    lVar9 = lVar9 + -1;
  }
  return;
}

Assistant:

static void consume_impl(const CONSUME_OPERATION & i_consume)
            {
                DENSITY_TEST_ASSERT(i_consume.complete_type().template is<ElementType>());

                auto &     data  = i_consume.template element<ElementType>();
                auto const count = data.m_blocks.size();

                exception_checkpoint();

                for (size_t index = 0; index < count; index++)
                {
                    auto const size      = count - index;
                    auto const fill_char = static_cast<char>('0' + size % 10);
                    auto const chars     = data.m_blocks[index];
                    for (size_t i = 0; i < size; i++)
                    {
                        DENSITY_TEST_ASSERT(chars[i] == fill_char);
                    }
                    DENSITY_TEST_ASSERT(chars[size] == 0);
                }
            }